

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.h
# Opt level: O1

StringBuffer * __thiscall MeCab::StringBuffer::operator<<(StringBuffer *this,unsigned_short n)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  StringBuffer *pSVar4;
  byte *pbVar5;
  ushort uVar6;
  ulong in_RDX;
  undefined6 in_register_00000032;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  char fbuf [64];
  byte local_48 [72];
  
  uVar7 = CONCAT62(in_register_00000032,n);
  pbVar2 = local_48;
  pbVar3 = local_48;
  if ((int)uVar7 != 0) {
    do {
      in_RDX = uVar7 & 0xffff;
      uVar8 = (uint)in_RDX / 10;
      *pbVar2 = (char)uVar7 + (char)uVar8 * -10 | 0x30;
      pbVar3 = pbVar2 + 1;
      uVar6 = (ushort)uVar7;
      pbVar2 = pbVar3;
      uVar7 = (ulong)uVar8;
    } while (9 < uVar6);
  }
  if (pbVar3 == local_48) {
    *pbVar3 = 0x30;
    pbVar3 = pbVar3 + 1;
  }
  *pbVar3 = 0;
  bVar9 = pbVar3 != local_48;
  pbVar3 = pbVar3 + -1;
  pbVar2 = (byte *)CONCAT71((int7)((ulong)local_48 >> 8),local_48 < pbVar3 && bVar9);
  pbVar5 = (byte *)CONCAT71((int7)(in_RDX >> 8),bVar9);
  if (local_48 < pbVar3 && bVar9) {
    pbVar5 = local_48 + 1;
    do {
      bVar1 = pbVar5[-1];
      pbVar5[-1] = *pbVar3;
      *pbVar3 = bVar1;
      pbVar3 = pbVar3 + -1;
      pbVar2 = pbVar5 + 1;
      bVar9 = pbVar5 < pbVar3;
      pbVar5 = pbVar2;
    } while (bVar9);
  }
  pSVar4 = (StringBuffer *)write(this,(int)local_48,pbVar5,(size_t)pbVar2);
  return pSVar4;
}

Assistant:

StringBuffer& operator<<(unsigned short int n) { _UITOA(n); }